

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  Snapshot *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  pointer ppcVar5;
  pointer ppcVar6;
  pointer ppcVar7;
  ulong uVar8;
  string outP;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string local_2b8;
  string local_298;
  cmGeneratedFileStream fout;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&fout,"CMAKE_TESTING_ENABLED",(allocator *)&local_2b8);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  if (bVar2) {
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configurationTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_2b8,this->Makefile,&configurationTypes,false);
    this_00 = &this->StateSnapshot;
    pcVar3 = cmState::Snapshot::GetCurrentBinaryDirectory(this_00);
    std::__cxx11::string::string((string *)&file,pcVar3,(allocator *)&fout);
    std::__cxx11::string::append((char *)&file);
    std::__cxx11::string::append((char *)&file);
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,file._M_dataplus._M_p,false);
    cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
    poVar4 = std::operator<<((ostream *)&fout,"# CMake generated Testfile for ");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# Source directory: ");
    pcVar3 = cmState::Snapshot::GetCurrentSourceDirectory(this_00);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# Build directory: ");
    pcVar3 = cmState::Snapshot::GetCurrentBinaryDirectory(this_00);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# ");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# This file includes the relevant testing commands ");
    poVar4 = std::operator<<(poVar4,"required for ");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"# testing this directory and lists subdirectories to ");
    poVar4 = std::operator<<(poVar4,"be tested as well.");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&outP,"TEST_INCLUDE_FILE",(allocator *)&local_298);
    pcVar3 = cmMakefile::GetProperty(pcVar1,&outP);
    std::__cxx11::string::~string((string *)&outP);
    if (pcVar3 != (char *)0x0) {
      poVar4 = std::operator<<((ostream *)&fout,"include(\"");
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,"\")");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    pcVar1 = this->Makefile;
    for (ppcVar7 = (pcVar1->TestGenerators).
                   super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl
                   .super__Vector_impl_data._M_start;
        ppcVar7 !=
        (pcVar1->TestGenerators).
        super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
      cmScriptGenerator::Generate
                (&(*ppcVar7)->super_cmScriptGenerator,(ostream *)&fout,&local_2b8,
                 &configurationTypes);
    }
    ppcVar6 = (this->Children).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar5 = (this->Children).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppcVar6 != ppcVar5) {
      for (uVar8 = 0; uVar8 < (ulong)((long)ppcVar5 - (long)ppcVar6 >> 3); uVar8 = uVar8 + 1) {
        std::operator<<((ostream *)&fout,"subdirs(");
        pcVar3 = cmMakefile::GetCurrentBinaryDirectory
                           ((this->Children).
                            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar8]->Makefile);
        std::__cxx11::string::string((string *)&outP,pcVar3,(allocator *)&local_298);
        cmOutputConverter::Convert
                  (&local_298,&this->super_cmOutputConverter,&outP,START_OUTPUT,UNCHANGED);
        std::operator<<((ostream *)&fout,(string *)&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        poVar4 = std::operator<<((ostream *)&fout,")");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&outP);
        ppcVar6 = (this->Children).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppcVar5 = (this->Children).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configurationTypes);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if ( !this->Makefile->IsOn("CMAKE_TESTING_ENABLED") )
    {
    return;
    }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file = this->StateSnapshot.GetCurrentBinaryDirectory();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetCurrentSourceDirectory() << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetCurrentBinaryDirectory() << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if ( testIncludeFile )
    {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
    }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const&
    testers = this->Makefile->GetTestGenerators();
  for(std::vector<cmTestGenerator*>::const_iterator gi = testers.begin();
      gi != testers.end(); ++gi)
    {
    (*gi)->Generate(fout, config, configurationTypes);
    }
  if (!this->Children.empty())
    {
    size_t i;
    for(i = 0; i < this->Children.size(); ++i)
      {
      // TODO: Use add_subdirectory instead?
      fout << "subdirs(";
      std::string outP =
        this->Children[i]->GetMakefile()->GetCurrentBinaryDirectory();
      fout << this->Convert(outP,START_OUTPUT);
      fout << ")" << std::endl;
      }
    }
}